

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

reference __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
::GrowAndEmplaceBack<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>
          (InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
           *this,QueueEntry *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  uint64 uVar3;
  undefined8 uVar4;
  QueueEntry *pQVar5;
  Rep *pRVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  Allocation new_allocation;
  
  uVar2 = (this->allocator_and_tag_).tag_.size_;
  uVar7 = uVar2 >> 1;
  uVar9 = 0x10;
  if ((uVar2 & 1) != 0) {
    uVar9 = *(ulong *)&this->rep_;
  }
  if (uVar7 == uVar9) {
    pQVar5 = __gnu_cxx::new_allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>::allocate
                       ((new_allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry> *)this,
                        uVar9 * 2,(void *)0x0);
    pQVar5[uVar7].index_cell = args->index_cell;
    uVar3 = (args->id).id_;
    pQVar5[uVar7].distance.super_S1ChordAngle.length2_ =
         (args->distance).super_S1ChordAngle.length2_;
    pQVar5[uVar7].id.id_ = uVar3;
    if (((this->allocator_and_tag_).tag_.size_ & 1) == 0) {
      pRVar6 = &this->rep_;
    }
    else {
      pRVar6 = *(Rep **)((long)&this->rep_ + 8);
    }
    if (1 < uVar2) {
      lVar8 = 0;
      do {
        *(undefined8 *)((long)&pQVar5->index_cell + lVar8) =
             *(undefined8 *)((long)pRVar6 + lVar8 + 0x10);
        uVar4 = ((undefined8 *)((long)pRVar6 + lVar8))[1];
        puVar1 = (undefined8 *)((long)&(pQVar5->distance).super_S1ChordAngle.length2_ + lVar8);
        *puVar1 = *(undefined8 *)((long)pRVar6 + lVar8);
        puVar1[1] = uVar4;
        lVar8 = lVar8 + 0x18;
      } while (uVar7 * 0x18 != lVar8);
    }
    new_allocation.buffer_ = pQVar5;
    new_allocation.capacity_ = uVar9 * 2;
    ResetAllocation(this,new_allocation,uVar7 + 1);
    return pQVar5 + uVar7;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, 16>::GrowAndEmplaceBack(Args &&...) [T = S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }